

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::DefineGroupFixedInst::Exec
          (DefineGroupFixedInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  int iVar1;
  Type TVar2;
  code *pcVar3;
  bool bVar4;
  char *pcVar5;
  GroupInfo *pGVar6;
  undefined4 *puVar7;
  
  if ((this->super_NoNeedToSaveMixin).noNeedToSave == false) {
    pcVar5 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
             Push<UnifiedRegex::ResetGroupCont>
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    iVar1 = (this->super_GroupMixin).groupId;
    pcVar5[8] = '\x03';
    *(undefined ***)pcVar5 = &PTR_Print_013e0248;
    *(int *)(pcVar5 + 0xc) = iVar1;
    Matcher::PushStats(matcher,contStack,input);
  }
  pGVar6 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  if (pGVar6->length != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xb20,"(groupInfo->IsUndefined())","groupInfo->IsUndefined()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  TVar2 = (this->super_FixedLengthMixin).length;
  pGVar6->offset = *inputOffset - TVar2;
  pGVar6->length = TVar2;
  *instPointer = *instPointer + 10;
  return false;
}

Assistant:

inline bool DefineGroupFixedInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (!noNeedToSave)
        {
            // UNDO ACTION: Restore group on backtrack
            PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
        Assert(groupInfo->IsUndefined());
        groupInfo->offset = inputOffset - length;
        groupInfo->length = length;

        instPointer += sizeof(*this);
        return false;
    }